

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O0

Error asmjit::X86Internal::emitArgMove
                (X86Emitter *emitter,X86Reg *dst_,uint32_t dstTypeId,Operand_ *src_,
                uint32_t srcTypeId,bool avxEnabled,char *comment)

{
  uint uVar1;
  Error EVar2;
  uint *puVar3;
  uint *in_RCX;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  uint in_R8D;
  byte in_R9B;
  undefined8 in_stack_00000008;
  uint32_t sign;
  uint32_t srcElement;
  uint32_t dstElement;
  uint32_t typeOp;
  int32_t instId;
  uint32_t srcSize;
  uint32_t dstSize;
  Operand src;
  X86Reg dst;
  uint32_t kSgn_1;
  uint32_t kSgn;
  uint32_t kSgn_2;
  Operand_ *in_stack_fffffffffffffaf8;
  uint in_stack_fffffffffffffb00;
  uint in_stack_fffffffffffffb04;
  undefined8 *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4cc;
  undefined4 local_4c8;
  bool local_4c2;
  bool local_4be;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  bool local_4ae;
  bool local_4ad;
  undefined4 local_4ac;
  bool local_4a4;
  bool local_4a3;
  bool local_49d;
  uint local_498;
  uint local_494;
  uint local_490;
  uint local_48c;
  uint local_488;
  undefined4 local_484;
  uint local_480;
  uint local_47c;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  byte local_455;
  uint local_454;
  uint local_444;
  long local_438;
  uint local_424;
  uint local_420;
  uint local_414;
  uint local_40c;
  uint local_408;
  uint local_404;
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3ec;
  uint local_3e4;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined8 *local_3a0;
  uint local_394;
  undefined8 *local_390;
  undefined4 local_384;
  undefined8 *local_380;
  undefined4 local_374;
  undefined8 *local_370;
  undefined4 local_364;
  undefined8 *local_360;
  undefined4 local_354;
  undefined8 *local_350;
  undefined4 local_344;
  undefined8 *local_340;
  undefined4 local_334;
  undefined8 *local_330;
  undefined4 local_324;
  undefined8 *local_320;
  undefined4 local_314;
  undefined8 *local_310;
  undefined4 local_304;
  undefined8 *local_300;
  undefined4 local_2f4;
  undefined8 *local_2f0;
  undefined4 local_2e4;
  undefined8 *local_2e0;
  undefined4 local_2d4;
  undefined8 *local_2d0;
  undefined4 local_2c4;
  undefined8 *local_2c0;
  undefined4 local_2b4;
  undefined8 *local_2b0;
  undefined4 local_2a4;
  undefined8 *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  uint local_288;
  uint local_284;
  undefined8 local_280;
  long local_278;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  uint local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  undefined4 local_20c;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined4 local_1f4;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  undefined4 local_1cc;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  char *local_170;
  char *local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined8 *local_140;
  undefined4 local_138;
  undefined4 local_134;
  undefined8 *local_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_118;
  undefined4 local_114;
  char *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  
  local_455 = in_R9B & 1;
  local_444 = in_EDX;
  if (in_EDX == 0) {
    local_444 = (uint)(byte)x86OpData[(ulong)(*in_RSI >> 3 & 0x1f) + 0xa0];
  }
  local_3ec = local_444;
  local_49d = 0x1f < local_444 && local_444 < 0x65;
  if (local_49d) {
    local_3e4 = local_444;
  }
  if (0x1f >= local_444 || (local_444 >= 0x65 || local_444 < 0x22)) {
    DebugUtils::assertionFailed
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
  }
  if (in_R8D < 0x20 || (100 < in_R8D || in_R8D < 0x22)) {
    DebugUtils::assertionFailed
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
  }
  local_260 = &local_468;
  local_468 = *(undefined8 *)in_RSI;
  local_460 = *(undefined8 *)(in_RSI + 2);
  local_3d8 = &local_478;
  local_478 = *(undefined8 *)in_RCX;
  local_470 = *(undefined8 *)(in_RCX + 2);
  local_40c = local_444;
  local_1b0 = local_3d8;
  if (0x7f < local_444) {
    DebugUtils::assertionFailed
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
  }
  local_47c = (uint)(byte)TypeId::_info[local_444];
  if (0x7f < in_R8D) {
    DebugUtils::assertionFailed
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
  }
  local_480 = (uint)(byte)TypeId::_info[in_R8D];
  local_484 = 0;
  local_414 = local_444;
  local_4a3 = 0x1f < local_444 && local_444 < 0x2a;
  local_454 = in_R8D;
  local_438 = in_RDI;
  if (local_4a3) {
    local_4a4 = 0x1f < in_R8D && in_R8D < 0x2a;
    if (local_4a4) {
      local_484 = 0x1a9;
      local_488 = local_444 << 8 | in_R8D;
      if (((((local_488 == 0x2422) || (local_488 == 0x2622)) || (local_488 == 0x2624)) ||
          ((local_488 == 0x2822 || (local_488 == 0x2824)))) ||
         (local_484 = 0x1aa, local_488 == 0x2826)) goto LAB_001578d8;
    }
    if ((0x1f < in_R8D && in_R8D < 0x2a) || ((*in_RCX & 7) == 2)) {
      if ((local_47c < 5) && (local_480 < 4)) {
        local_484 = 0x1ad;
        local_290 = &local_468;
        local_294 = 0x4000029;
        local_468._4_4_ = (undefined4)((ulong)local_468 >> 0x20);
        local_468 = CONCAT44(local_468._4_4_,0x4000029);
      }
      else {
        local_484 = 0x189;
        puVar3 = std::min<unsigned_int>(&local_480,&local_47c);
        local_480 = *puVar3;
        if (local_480 == 4) {
          local_4ac = 0x4000029;
        }
        else {
          local_4ac = 0x8000031;
        }
        local_2a0 = &local_468;
        local_2a4 = local_4ac;
        local_468 = CONCAT44(local_468._4_4_,local_4ac);
        local_230 = &local_478;
        local_1a8 = local_230;
        if (((uint)local_478 & 7) == 1) {
          local_228 = &local_468;
          local_2b4 = local_4ac;
          local_2b0 = &local_478;
          local_478 = CONCAT44(local_478._4_4_,local_4ac);
        }
      }
      goto LAB_001578d8;
    }
    puVar3 = std::min<unsigned_int>(&local_480,&local_47c);
    local_480 = *puVar3;
    local_3f4 = local_454;
    local_4ad = 0x30 < local_454 && local_454 < 0x33;
    if (local_4ad) {
      local_484 = 0x1a2;
      if (local_480 != 8) {
        local_484 = 0x18d;
        local_2c0 = &local_468;
        local_2c4 = 0x4000029;
        local_468 = CONCAT44(local_468._4_4_,0x4000029);
      }
      goto LAB_001578d8;
    }
    local_218 = local_454;
    local_4ae = 0x2c < local_454 && local_454 < 0x31;
    if (local_4ae) {
      if (local_480 == 1) {
        local_4b4 = 0x13f;
      }
      else {
        if (local_480 == 2) {
          local_4b8 = 0x142;
        }
        else {
          local_4b8 = 0x141;
          if (local_480 == 4) {
            local_4b8 = 0x140;
          }
        }
        local_4b4 = local_4b8;
      }
      local_484 = local_4b4;
      if (local_480 < 5) {
        local_4bc = 0x4000029;
      }
      else {
        local_4bc = 0x8000031;
      }
      local_2d0 = &local_468;
      local_2d4 = local_4bc;
      local_468 = CONCAT44(local_468._4_4_,local_4bc);
      local_210 = local_480;
      goto LAB_001578d8;
    }
    local_400 = local_454;
    if (0x32 < local_454 && local_454 < 0x65) {
      local_484 = 0x1a2;
      if ((local_455 & 1) != 0) {
        local_484 = 0x3f5;
      }
      if (local_480 != 8) {
        local_484 = 0x18d;
        if ((local_455 & 1) != 0) {
          local_484 = 0x3df;
        }
        local_2e0 = &local_468;
        local_2e4 = 0x4000029;
        local_468 = CONCAT44(local_468._4_4_,0x4000029);
      }
      goto LAB_001578d8;
    }
  }
  local_3f8 = local_444;
  local_4be = 0x30 < local_444 && local_444 < 0x33;
  if (local_4be) {
    local_484 = 0x1a2;
    puVar3 = std::min<unsigned_int>(&local_480,&local_47c);
    local_480 = *puVar3;
    local_420 = local_454;
    if (local_454 < 0x20 || 0x29 < local_454) {
      local_3b0 = (char *)&local_478;
      in_stack_fffffffffffffefc = 7;
      local_170 = local_3b0;
      in_stack_ffffffffffffff00 = local_3b0;
      if (((uint)local_478 & 7) != 2) {
        local_3fc = local_454;
        if (0x30 < local_454 && local_454 < 0x33) goto LAB_001578d8;
        local_484 = 399;
        local_404 = local_454;
        if (0x32 < local_454 && local_454 < 0x65) goto LAB_001578d8;
        goto LAB_00156dd9;
      }
    }
    if (local_480 != 8) {
      local_484 = 0x18d;
      local_238 = &local_478;
      local_1a0 = local_238;
      if (((uint)local_478 & 7) == 1) {
        local_2f0 = &local_478;
        local_2f4 = 0x4000029;
        local_478 = CONCAT44(local_478._4_4_,0x4000029);
      }
    }
    goto LAB_001578d8;
  }
LAB_00156dd9:
  local_21c = local_444;
  local_4c2 = 0x2c < local_444 && local_444 < 0x31;
  if (local_4c2) {
    puVar3 = std::min<unsigned_int>(&local_480,&local_47c);
    local_480 = *puVar3;
    local_424 = local_454;
    if ((local_454 < 0x20 || 0x29 < local_454) &&
       (local_220 = local_454, local_454 < 0x2d || 0x30 < local_454)) {
      local_3b8 = (char *)&local_478;
      local_114 = 7;
      local_118 = 0;
      local_168 = local_3b8;
      in_stack_fffffffffffffef0 = local_3b8;
      if (((uint)local_478 & 7) != 2) goto LAB_00156fea;
    }
    if (local_480 == 1) {
      local_4c8 = 0x13f;
    }
    else {
      if (local_480 == 2) {
        local_4cc = 0x142;
      }
      else {
        local_4cc = 0x141;
        if (local_480 == 4) {
          local_4cc = 0x140;
        }
      }
      local_4c8 = local_4cc;
    }
    local_484 = local_4c8;
    local_1f0 = &local_478;
    local_1f4 = 1;
    local_214 = local_480;
    local_1e8 = local_1f0;
    if ((((uint)local_478 & 0xf07) == 1) && (local_480 < 5)) {
      local_300 = &local_478;
      local_304 = 0x4000029;
      local_478 = CONCAT44(local_478._4_4_,0x4000029);
    }
    goto LAB_001578d8;
  }
LAB_00156fea:
  local_408 = local_444;
  if (local_444 < 0x33 || 100 < local_444) {
    return 4;
  }
  local_310 = &local_468;
  local_314 = 0x10000149;
  local_468 = CONCAT44(local_468._4_4_,0x10000149);
  local_1e0 = &local_478;
  if ((uint)local_478 == 0x8000289) {
    local_484 = 0x1a3;
    goto LAB_001578d8;
  }
  local_284 = local_444;
  if (0x7f < local_444) {
    DebugUtils::assertionFailed
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
  }
  local_48c = (uint)(byte)TypeId::_info[(ulong)local_444 + 0x80];
  local_288 = local_454;
  if (0x7f < local_454) {
    DebugUtils::assertionFailed
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
  }
  local_490 = (uint)(byte)TypeId::_info[(ulong)local_454 + 0x80];
  if ((local_48c == 0x2a) && (local_490 == 0x2b)) {
    local_494 = local_47c << 1;
    puVar3 = std::min<unsigned_int>(&local_494,&local_480);
    local_480 = *puVar3;
    local_47c = local_480 >> 1;
    if (local_480 < 9) {
      local_484 = 0x83;
      if ((local_455 & 1) != 0) {
        local_484 = 0x324;
      }
    }
    else {
      local_484 = 0x7d;
      if ((local_455 & 1) != 0) {
        local_484 = 0x318;
      }
    }
    if (local_47c == 0x20) {
      local_320 = &local_468;
      local_324 = 0x20000151;
      local_468 = CONCAT44(local_468._4_4_,0x20000151);
    }
    local_240 = &local_478;
    local_198 = local_240;
    if (((uint)local_478 & 7) == 1) {
      if (local_480 < 0x11) {
        local_4dc = 0x10000149;
      }
      else {
        if (local_480 < 0x21) {
          local_4e0 = 0x20000151;
        }
        else {
          local_4e0 = 0x40000159;
        }
        local_4dc = local_4e0;
      }
      local_330 = &local_478;
      local_334 = local_4dc;
      local_478 = CONCAT44(local_478._4_4_,local_4dc);
      local_1d0 = local_480;
    }
    goto LAB_001578d8;
  }
  if ((local_48c == 0x2b) && (local_490 == 0x2a)) {
    local_498 = local_480 << 1;
    puVar3 = std::min<unsigned_int>(&local_47c,&local_498);
    local_480 = *puVar3 >> 1;
    local_47c = local_480 << 1;
    if (local_480 < 5) {
      local_484 = 0x80;
      if ((local_455 & 1) != 0) {
        local_484 = 800;
      }
    }
    else {
      local_484 = 0x79;
      if ((local_455 & 1) != 0) {
        local_484 = 0x312;
      }
    }
    if (local_47c < 0x11) {
      local_4e4 = 0x10000149;
    }
    else {
      if (local_47c < 0x21) {
        local_4e8 = 0x20000151;
      }
      else {
        local_4e8 = 0x40000159;
      }
      local_4e4 = local_4e8;
    }
    local_340 = &local_468;
    local_344 = local_4e4;
    local_468 = CONCAT44(local_468._4_4_,local_4e4);
    local_248 = &local_478;
    local_1d4 = local_47c;
    local_190 = local_248;
    if ((((uint)local_478 & 7) == 1) && (0x1f < local_480)) {
      local_350 = &local_478;
      local_354 = 0x20000151;
      local_478 = CONCAT44(local_478._4_4_,0x20000151);
    }
    goto LAB_001578d8;
  }
  puVar3 = std::min<unsigned_int>(&local_480,&local_47c);
  local_480 = *puVar3;
  local_208 = &local_478;
  local_20c = 1;
  local_200 = local_208;
  if (((uint)local_478 & 0xf07) == 1) {
LAB_001575ed:
    if (local_480 < 5) {
      local_484 = 0x18d;
      if ((local_455 & 1) != 0) {
        local_484 = 0x3df;
      }
      local_250 = &local_478;
      local_188 = local_250;
      if (((uint)local_478 & 7) == 1) {
        local_360 = &local_478;
        local_364 = 0x4000029;
        local_478 = CONCAT44(local_478._4_4_,0x4000029);
      }
      goto LAB_001578d8;
    }
    if (local_480 == 8) {
      local_484 = 0x1a2;
      if ((local_455 & 1) != 0) {
        local_484 = 0x3f5;
      }
      goto LAB_001578d8;
    }
  }
  else {
    local_3c0 = &local_478;
    local_124 = 7;
    local_128 = 0;
    local_160 = local_3c0;
    local_120 = local_3c0;
    if (((uint)local_478 & 7) == 2) goto LAB_001575ed;
  }
  local_1c8 = &local_478;
  local_1cc = 0x101;
  if (((uint)local_478 & 0xf07) != 0x101) {
    local_3c8 = &local_478;
    local_134 = 7;
    local_138 = 0;
    local_158 = local_3c8;
    local_130 = local_3c8;
    if (((uint)local_478 & 7) != 2) {
      return 4;
    }
  }
  local_484 = 0x18b;
  if ((local_455 & 1) != 0) {
    local_484 = 0x3de;
  }
  if (local_480 < 0x11) {
    in_stack_fffffffffffffb14 = 0x10000149;
  }
  else if (local_480 < 0x21) {
    in_stack_fffffffffffffb10 = 0x20000151;
    in_stack_fffffffffffffb14 = in_stack_fffffffffffffb10;
  }
  else {
    in_stack_fffffffffffffb10 = 0x40000159;
    in_stack_fffffffffffffb14 = in_stack_fffffffffffffb10;
  }
  local_370 = &local_468;
  local_468 = CONCAT44(local_468._4_4_,in_stack_fffffffffffffb14);
  local_258 = &local_478;
  local_374 = in_stack_fffffffffffffb14;
  local_1d8 = local_480;
  local_1c0 = local_1c8;
  local_180 = local_258;
  if (((uint)local_478 & 7) == 1) {
    local_380 = &local_478;
    local_478 = CONCAT44(local_478._4_4_,in_stack_fffffffffffffb14);
    local_384 = in_stack_fffffffffffffb14;
  }
LAB_001578d8:
  local_3d0 = &local_478;
  local_144 = 7;
  local_148 = 0;
  uVar1 = (uint)local_478;
  local_150 = local_3d0;
  local_140 = local_3d0;
  if (((uint)local_478 & 7) == 2) {
    in_stack_fffffffffffffb08 = &local_478;
    local_394 = local_480;
    local_3a0 = in_stack_fffffffffffffb08;
    local_390 = in_stack_fffffffffffffb08;
    if (0xff < local_480) {
      DebugUtils::assertionFailed
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
    }
    in_stack_fffffffffffffb04 = (uint)local_478 & 0xffffff;
    local_478 = CONCAT44(local_478._4_4_,in_stack_fffffffffffffb04 | local_480 << 0x18);
    in_stack_fffffffffffffb00 = uVar1;
  }
  local_278 = local_438;
  local_280 = in_stack_00000008;
  *(undefined8 *)(local_438 + 0x40) = in_stack_00000008;
  EVar2 = CodeEmitter::emit((CodeEmitter *)
                            CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                            (uint32_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                            (Operand_ *)
                            CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                            in_stack_fffffffffffffaf8);
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::emitArgMove(X86Emitter* emitter,
  const X86Reg& dst_, uint32_t dstTypeId,
  const Operand_& src_, uint32_t srcTypeId, bool avxEnabled, const char* comment) {

  // Deduce optional `dstTypeId`, which may be `TypeId::kVoid` in some cases.
  if (!dstTypeId) dstTypeId = x86OpData.archRegs.regTypeToTypeId[dst_.getType()];

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeId::isValid(dstTypeId) && !TypeId::isAbstract(dstTypeId));
  ASMJIT_ASSERT(TypeId::isValid(srcTypeId) && !TypeId::isAbstract(srcTypeId));

  X86Reg dst(dst_);
  Operand src(src_);

  uint32_t dstSize = TypeId::sizeOf(dstTypeId);
  uint32_t srcSize = TypeId::sizeOf(srcTypeId);

  int32_t instId = Globals::kInvalidInstId;

  // Not a real loop, just 'break' is nicer than 'goto'.
  for (;;) {
    if (TypeId::isInt(dstTypeId)) {
      if (TypeId::isInt(srcTypeId)) {
        instId = X86Inst::kIdMovsx;
        uint32_t typeOp = (dstTypeId << 8) | srcTypeId;

        // Sign extend by using 'movsx'.
        if (typeOp == ((TypeId::kI16 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI16) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI16)) break;

        // Sign extend by using 'movsxd'.
        instId = X86Inst::kIdMovsxd;
        if (typeOp == ((TypeId::kI64 << 8) | TypeId::kI32)) break;
      }

      if (TypeId::isInt(srcTypeId) || src_.isMem()) {
        // Zero extend by using 'movzx' or 'mov'.
        if (dstSize <= 4 && srcSize < 4) {
          instId = X86Inst::kIdMovzx;
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        }
        else {
          // We should have caught all possibilities where `srcSize` is less
          // than 4, so we don't have to worry about 'movzx' anymore. Minimum
          // size is enough to determine if we want 32-bit or 64-bit move.
          instId = X86Inst::kIdMov;
          srcSize = std::min(srcSize, dstSize);

          dst.setSignature(srcSize == 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                        : X86Reg::signatureOfT<X86Reg::kRegGpq>());
          if (src.isReg()) src.setSignature(dst.getSignature());
        }
        break;
      }

      // NOTE: The previous branch caught all memory sources, from here it's
      // always register to register conversion, so catch the remaining cases.
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isMmx(srcTypeId)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMask(srcTypeId)) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        dst.setSignature(srcSize <= 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                      : X86Reg::signatureOfT<X86Reg::kRegGpq>());
        break;
      }

      if (TypeId::isVec(srcTypeId)) {
        // 64-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isMmx(dstTypeId)) {
      instId = X86Inst::kIdMovq;
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || src.isMem()) {
        // 64-bit move.
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMmx(srcTypeId)) break;

      // NOTE: This will hurt if `avxEnabled`.
      instId = X86Inst::kIdMovdq2q;
      if (TypeId::isVec(srcTypeId)) break;
    }

    if (TypeId::isMask(dstTypeId)) {
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || TypeId::isMask(srcTypeId) || src.isMem()) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        if (X86Reg::isGp(src) && srcSize <= 4) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isVec(dstTypeId)) {
      // By default set destination to XMM, will be set to YMM|ZMM if needed.
      dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegXmm>());

      // NOTE: This will hurt if `avxEnabled`.
      if (X86Reg::isMm(src)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq2dq;
        break;
      }

      // Argument conversion.
      uint32_t dstElement = TypeId::elementOf(dstTypeId);
      uint32_t srcElement = TypeId::elementOf(srcTypeId);

      if (dstElement == TypeId::kF32 && srcElement == TypeId::kF64) {
        srcSize = std::min(dstSize * 2, srcSize);
        dstSize = srcSize / 2;

        if (srcSize <= 8)
          instId = avxEnabled ? X86Inst::kIdVcvtss2sd : X86Inst::kIdCvtss2sd;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtps2pd : X86Inst::kIdCvtps2pd;

        if (dstSize == 32)
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        if (src.isReg())
          src.setSignature(X86Reg::signatureOfVecBySize(srcSize));
        break;
      }

      if (dstElement == TypeId::kF64 && srcElement == TypeId::kF32) {
        srcSize = std::min(dstSize, srcSize * 2) / 2;
        dstSize = srcSize * 2;

        if (srcSize <= 4)
          instId = avxEnabled ? X86Inst::kIdVcvtsd2ss : X86Inst::kIdCvtsd2ss;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtpd2ps : X86Inst::kIdCvtpd2ps;

        dst.setSignature(X86Reg::signatureOfVecBySize(dstSize));
        if (src.isReg() && srcSize >= 32)
          src.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        break;
      }

      srcSize = std::min(srcSize, dstSize);
      if (X86Reg::isGp(src) || src.isMem()) {
        // 32-bit move.
        if (srcSize <= 4) {
          instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
          if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
          break;
        }

        // 64-bit move.
        if (srcSize == 8) {
          instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
          break;
        }
      }

      if (X86Reg::isVec(src) || src.isMem()) {
        instId = avxEnabled ? X86Inst::kIdVmovaps : X86Inst::kIdMovaps;
        uint32_t sign = X86Reg::signatureOfVecBySize(srcSize);

        dst.setSignature(sign);
        if (src.isReg()) src.setSignature(sign);
        break;
      }
    }

    return DebugUtils::errored(kErrorInvalidState);
  }

  if (src.isMem())
    src.as<X86Mem>().setSize(srcSize);

  emitter->setInlineComment(comment);
  return emitter->emit(instId, dst, src);
}